

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::Option::remove_excludes(Option *this,Option *opt)

{
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *in_RDI;
  _Rb_tree_const_iterator<CLI::Option_*> iterator;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  *in_stack_ffffffffffffffa8;
  const_iterator in_stack_ffffffffffffffb8;
  _Rb_tree_const_iterator<CLI::Option_*> in_stack_ffffffffffffffc0;
  _Rb_tree_const_iterator<CLI::Option_*> in_stack_ffffffffffffffc8;
  _Self local_20 [3];
  bool local_1;
  
  ::std::begin<std::set<CLI::Option*,std::less<CLI::Option*>,std::allocator<CLI::Option*>>>
            (in_stack_ffffffffffffffa8);
  ::std::end<std::set<CLI::Option*,std::less<CLI::Option*>,std::allocator<CLI::Option*>>>
            (in_stack_ffffffffffffffa8);
  local_20[0]._M_node =
       (_Base_ptr)
       ::std::find<std::_Rb_tree_const_iterator<CLI::Option*>,CLI::Option*>
                 (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                  in_stack_ffffffffffffffb8._M_node);
  ::std::end<std::set<CLI::Option*,std::less<CLI::Option*>,std::allocator<CLI::Option*>>>
            (in_stack_ffffffffffffffa8);
  local_1 = std::operator==(local_20,(_Self *)&stack0xffffffffffffffc8);
  if (!local_1) {
    ::std::set<CLI::Option*,std::less<CLI::Option*>,std::allocator<CLI::Option*>>::erase_abi_cxx11_
              (in_RDI,in_stack_ffffffffffffffb8);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

CLI11_INLINE bool Option::remove_excludes(Option *opt) {
    auto iterator = std::find(std::begin(excludes_), std::end(excludes_), opt);

    if(iterator == std::end(excludes_)) {
        return false;
    }
    excludes_.erase(iterator);
    return true;
}